

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_function_call
          (t_cpp_generator *this,ostream *out,t_function *tfunction,string *target,string *iface,
          string *arg_prefix)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  size_type sVar5;
  char *pcVar6;
  pointer pptVar7;
  string local_50;
  
  ttype = t_type::get_true_type(tfunction->returntype_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((tfunction->oneway_ == false) &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype), (char)iVar3 == '\0')) {
    bVar2 = is_complex_type(this,ttype);
    if (bVar2) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(iface->_M_dataplus)._M_p,iface->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(tfunction->name_)._M_dataplus._M_p,
                          (tfunction->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(target->_M_dataplus)._M_p,target->_M_string_length);
      bVar2 = false;
      goto LAB_0019c437;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(target->_M_dataplus)._M_p,target->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    pcVar6 = (iface->_M_dataplus)._M_p;
    sVar5 = iface->_M_string_length;
  }
  else {
    pcVar6 = (iface->_M_dataplus)._M_p;
    sVar5 = iface->_M_string_length;
    poVar4 = out;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(tfunction->name_)._M_dataplus._M_p,(tfunction->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  bVar2 = true;
LAB_0019c437:
  ptVar1 = tfunction->arglist_;
  pptVar7 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(arg_prefix->_M_dataplus)._M_p,arg_prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,((*pptVar7)->name_)._M_dataplus._M_p,((*pptVar7)->name_)._M_string_length);
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_function_call(ostream& out,
                                             t_function* tfunction,
                                             string target,
                                             string iface,
                                             string arg_prefix) {
  bool first = true;
  t_type* ret_type = get_true_type(tfunction->get_returntype());
  out << indent();
  if (!tfunction->is_oneway() && !ret_type->is_void()) {
    if (is_complex_type(ret_type)) {
      first = false;
      out << iface << "->" << tfunction->get_name() << "(" << target;
    } else {
      out << target << " = " << iface << "->" << tfunction->get_name() << "(";
    }
  } else {
    out << iface << "->" << tfunction->get_name() << "(";
  }
  const std::vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << arg_prefix << (*f_iter)->get_name();
  }
  out << ");" << endl;
}